

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  uint uVar1;
  lua_CFunction p_Var2;
  Value *pVVar3;
  int iVar4;
  TValue *io2;
  TValue *pTVar5;
  char *name;
  ZIO z;
  
  name = "?";
  if (chunkname != (char *)0x0) {
    name = chunkname;
  }
  luaZ_init(L,&z,reader,data);
  iVar4 = luaD_protectedparser(L,&z,name,mode);
  if ((iVar4 == 0) && (p_Var2 = L->top[-1].value_.f, p_Var2[10] == (_func_int_lua_State_ptr)0x1)) {
    pTVar5 = luaH_getint(&((L->l_G->l_registry).value_.gc)->h,2);
    pVVar3 = *(Value **)(*(long *)(p_Var2 + 0x20) + 0x10);
    *pVVar3 = pTVar5->value_;
    uVar1 = pTVar5->tt_;
    pVVar3[1].b = uVar1;
    if (((uVar1 & 0x40) != 0) &&
       ((((((pTVar5->value_).gc)->gch).marked & 3) != 0 &&
        ((((*(GCObject **)(p_Var2 + 0x20))->gch).marked & 4) != 0)))) {
      luaC_barrier_(L,*(GCObject **)(p_Var2 + 0x20),(pTVar5->value_).gc);
    }
  }
  return iVar4;
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    LClosure *f = clLvalue(L->top - 1);  /* get newly created function */
    if (f->nupvalues == 1) {  /* does it have one upvalue? */
      /* get global table from registry */
      Table *reg = hvalue(&G(L)->l_registry);
      const TValue *gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
      /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
      setobj(L, f->upvals[0]->v, gt);
      luaC_barrier(L, f->upvals[0], gt);
    }
  }
  lua_unlock(L);
  return status;
}